

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_swap(Tree *this,size_t n_,size_t m_)

{
  size_t *psVar1;
  csubstr *pcVar2;
  csubstr *pcVar3;
  NodeData *pNVar4;
  NodeType_e NVar5;
  code *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  Location LVar18;
  Location LVar19;
  bool bVar20;
  size_t sVar21;
  NodeType NVar22;
  NodeType NVar23;
  NodeData *pNVar24;
  ulong uVar25;
  ulong extraout_RDX;
  Tree *pTVar26;
  char msg [59];
  char local_b8 [24];
  char *pcStack_a0;
  char local_98 [40];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  sVar21 = parent(this,n_);
  if ((sVar21 == 0xffffffffffffffff) && (NVar22 = type(this,n_), NVar22.type != NOTYPE)) {
    builtin_strncpy(local_98 + 0x10,"== NOTYPE)",0xb);
    builtin_strncpy(local_98,"NE) || type(n_) ",0x10);
    builtin_strncpy(local_b8 + 0x10,"parent(n",8);
    pcStack_a0 = (char *)0x4f4e203d2120295f;
    builtin_strncpy(local_b8,"check failed: ((",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    local_48 = 0;
    uStack_40 = 0x6447;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar18.super_LineCol.col = 0;
    LVar18.super_LineCol.offset = SUB168(ZEXT816(0x6447) << 0x40,0);
    LVar18.super_LineCol.line = SUB168(ZEXT816(0x6447) << 0x40,8);
    LVar18.name.str._0_4_ = 0x2466fd;
    LVar18.name.str._4_4_ = 0;
    LVar18.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x3b,LVar18,(this->m_callbacks).m_user_data);
  }
  sVar21 = parent(this,m_);
  if ((sVar21 == 0xffffffffffffffff) && (NVar22 = type(this,m_), NVar22.type != NOTYPE)) {
    builtin_strncpy(local_98 + 0x10,"== NOTYPE)",0xb);
    builtin_strncpy(local_98,"NE) || type(m_) ",0x10);
    builtin_strncpy(local_b8 + 0x10,"parent(m",8);
    pcStack_a0 = (char *)0x4f4e203d2120295f;
    builtin_strncpy(local_b8,"check failed: ((",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    local_70 = 0;
    uStack_68 = 0x6448;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar19.super_LineCol.col = 0;
    LVar19.super_LineCol.offset = SUB168(ZEXT816(0x6448) << 0x40,0);
    LVar19.super_LineCol.line = SUB168(ZEXT816(0x6448) << 0x40,8);
    LVar19.name.str._0_4_ = 0x2466fd;
    LVar19.name.str._4_4_ = 0;
    LVar19.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x3b,LVar19,(this->m_callbacks).m_user_data);
  }
  NVar22 = type(this,n_);
  sVar21 = m_;
  pTVar26 = this;
  NVar23 = type(this,m_);
  if (NVar22.type == NOTYPE) {
    if (NVar23.type == NOTYPE) {
      _swap();
      uVar25 = pTVar26->m_cap;
      if (sVar21 == 0xffffffffffffffff || uVar25 <= sVar21) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar25 = pTVar26->m_cap;
      }
      pNVar4 = pTVar26->m_buf;
      if ((extraout_RDX == 0xffffffffffffffff) || (pNVar24 = pNVar4, uVar25 <= extraout_RDX)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar24 = pTVar26->m_buf;
      }
      NVar5 = pNVar4[sVar21].m_type.type;
      pNVar4[sVar21].m_type.type = pNVar24[extraout_RDX].m_type.type;
      pNVar24[extraout_RDX].m_type.type = NVar5;
      pcVar7 = pNVar4[sVar21].m_key.tag.str;
      sVar8 = pNVar4[sVar21].m_key.tag.len;
      pcVar2 = &pNVar4[sVar21].m_key.scalar;
      pcVar9 = pcVar2->str;
      sVar10 = pcVar2->len;
      pcVar2 = &pNVar4[sVar21].m_key.anchor;
      pcVar11 = pcVar2->str;
      sVar12 = pcVar2->len;
      pcVar13 = pNVar24[extraout_RDX].m_key.tag.str;
      sVar14 = pNVar24[extraout_RDX].m_key.tag.len;
      pcVar2 = &pNVar24[extraout_RDX].m_key.scalar;
      pcVar15 = pcVar2->str;
      sVar16 = pcVar2->len;
      pcVar2 = &pNVar24[extraout_RDX].m_key.anchor;
      sVar17 = pcVar2->len;
      pcVar3 = &pNVar4[sVar21].m_key.anchor;
      pcVar3->str = pcVar2->str;
      pcVar3->len = sVar17;
      pcVar2 = &pNVar4[sVar21].m_key.scalar;
      pcVar2->str = pcVar15;
      pcVar2->len = sVar16;
      pNVar4[sVar21].m_key.tag.str = pcVar13;
      pNVar4[sVar21].m_key.tag.len = sVar14;
      pcVar2 = &pNVar24[extraout_RDX].m_key.anchor;
      pcVar2->str = pcVar11;
      pcVar2->len = sVar12;
      pcVar2 = &pNVar24[extraout_RDX].m_key.scalar;
      pcVar2->str = pcVar9;
      pcVar2->len = sVar10;
      pNVar24[extraout_RDX].m_key.tag.str = pcVar7;
      pNVar24[extraout_RDX].m_key.tag.len = sVar8;
      pcVar7 = pNVar4[sVar21].m_val.tag.str;
      sVar8 = pNVar4[sVar21].m_val.tag.len;
      pcVar2 = &pNVar4[sVar21].m_val.scalar;
      pcVar9 = pcVar2->str;
      sVar10 = pcVar2->len;
      pcVar2 = &pNVar4[sVar21].m_val.anchor;
      pcVar11 = pcVar2->str;
      sVar12 = pcVar2->len;
      pcVar13 = pNVar24[extraout_RDX].m_val.tag.str;
      sVar14 = pNVar24[extraout_RDX].m_val.tag.len;
      pcVar2 = &pNVar24[extraout_RDX].m_val.scalar;
      pcVar15 = pcVar2->str;
      sVar16 = pcVar2->len;
      pcVar2 = &pNVar24[extraout_RDX].m_val.anchor;
      sVar17 = pcVar2->len;
      pcVar3 = &pNVar4[sVar21].m_val.anchor;
      pcVar3->str = pcVar2->str;
      pcVar3->len = sVar17;
      pcVar2 = &pNVar4[sVar21].m_val.scalar;
      pcVar2->str = pcVar15;
      pcVar2->len = sVar16;
      pNVar4[sVar21].m_val.tag.str = pcVar13;
      pNVar4[sVar21].m_val.tag.len = sVar14;
      pcVar2 = &pNVar24[extraout_RDX].m_val.anchor;
      pcVar2->str = pcVar11;
      pcVar2->len = sVar12;
      pcVar2 = &pNVar24[extraout_RDX].m_val.scalar;
      pcVar2->str = pcVar9;
      pcVar2->len = sVar10;
      pNVar24[extraout_RDX].m_val.tag.str = pcVar7;
      pNVar24[extraout_RDX].m_val.tag.len = sVar8;
      return;
    }
    _copy_props(this,n_,this,m_);
    _free_list_rem(this,n_);
    _copy_hierarchy(this,n_,m_);
    if ((m_ == 0xffffffffffffffff) || (this->m_cap <= m_)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x7d;
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar4 = this->m_buf;
    *(undefined1 (*) [16])&pNVar4[m_].m_val.scalar.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[m_].m_val.tag.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[m_].m_key.anchor.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[m_].m_key.scalar.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[m_].m_key.tag.len = (undefined1  [16])0x0;
    pNVar4[m_].m_type = NOTYPE;
    pNVar4[m_].m_key.tag.str = (char *)0x0;
    pNVar4[m_].m_val.anchor.len = 0;
    psVar1 = &pNVar4[m_].m_parent;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(undefined4 *)(psVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 0xc) = 0xffffffff;
    pNVar4[m_].m_last_child = 0xffffffffffffffff;
    n_ = m_;
  }
  else {
    if (NVar23.type != NOTYPE) {
      _swap_props(this,n_,m_);
      _swap_hierarchy(this,n_,m_);
      return;
    }
    _copy_props(this,m_,this,n_);
    _free_list_rem(this,m_);
    _copy_hierarchy(this,m_,n_);
    if ((n_ == 0xffffffffffffffff) || (this->m_cap <= n_)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar20 = is_debugger_attached(), bVar20)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x7d;
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar4 = this->m_buf;
    *(undefined1 (*) [16])&pNVar4[n_].m_val.scalar.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[n_].m_val.tag.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[n_].m_key.anchor.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[n_].m_key.scalar.len = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&pNVar4[n_].m_key.tag.len = (undefined1  [16])0x0;
    pNVar4[n_].m_type = NOTYPE;
    pNVar4[n_].m_key.tag.str = (char *)0x0;
    pNVar4[n_].m_val.anchor.len = 0;
    psVar1 = &pNVar4[n_].m_parent;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(undefined4 *)(psVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 0xc) = 0xffffffff;
    pNVar4[n_].m_last_child = 0xffffffffffffffff;
  }
  _free_list_add(this,n_);
  return;
}

Assistant:

void Tree::_swap(size_t n_, size_t m_)
{
    _RYML_CB_ASSERT(m_callbacks, (parent(n_) != NONE) || type(n_) == NOTYPE);
    _RYML_CB_ASSERT(m_callbacks, (parent(m_) != NONE) || type(m_) == NOTYPE);
    NodeType tn = type(n_);
    NodeType tm = type(m_);
    if(tn != NOTYPE && tm != NOTYPE)
    {
        _swap_props(n_, m_);
        _swap_hierarchy(n_, m_);
    }
    else if(tn == NOTYPE && tm != NOTYPE)
    {
        _copy_props(n_, m_);
        _free_list_rem(n_);
        _copy_hierarchy(n_, m_);
        _clear(m_);
        _free_list_add(m_);
    }
    else if(tn != NOTYPE && tm == NOTYPE)
    {
        _copy_props(m_, n_);
        _free_list_rem(m_);
        _copy_hierarchy(m_, n_);
        _clear(n_);
        _free_list_add(n_);
    }
    else
    {
        C4_NEVER_REACH();
    }
}